

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O0

bool __thiscall
glcts::TessellationShaderVertexSpacing::_tess_coordinate::operator==
          (_tess_coordinate *this,_tess_coordinate *in)

{
  float fVar1;
  _tess_coordinate *in_local;
  _tess_coordinate *this_local;
  
  fVar1 = de::abs<float>(*(float *)this - *(float *)in);
  if (((fVar1 < 0.001) &&
      (fVar1 = de::abs<float>(*(float *)(this + 4) - *(float *)(in + 4)), fVar1 < 0.001)) &&
     (fVar1 = de::abs<float>(*(float *)(this + 8) - *(float *)(in + 8)), fVar1 < 0.001)) {
    return true;
  }
  return false;
}

Assistant:

bool TessellationShaderVertexSpacing::_tess_coordinate::operator==(
	const TessellationShaderVertexSpacing::_tess_coordinate& in) const
{
	if (de::abs(this->u - in.u) < epsilon && de::abs(this->v - in.v) < epsilon && de::abs(this->w - in.w) < epsilon)
	{
		return true;
	}
	else
	{
		return false;
	}
}